

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_rgn_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  int iVar2;
  uint_fast8_t tmp;
  byte local_19;
  
  if (cstate->numcomps < 0x101) {
    iVar1 = jpc_getuint8(in,&local_19);
    if (iVar1 != 0) {
      return -1;
    }
    *(ulong *)&ms->parms = (ulong)local_19;
  }
  else {
    iVar1 = jpc_getuint16(in,(uint_fast16_t *)&(ms->parms).soc);
    if (iVar1 != 0) {
      return -1;
    }
  }
  iVar2 = jpc_getuint8(in,&(ms->parms).rgn.roisty);
  iVar1 = -1;
  if (iVar2 == 0) {
    iVar1 = jpc_getuint8(in,&(ms->parms).rgn.roishift);
    iVar1 = -(uint)(iVar1 != 0);
  }
  return iVar1;
}

Assistant:

static int jpc_rgn_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_rgn_t *rgn = &ms->parms.rgn;
	uint_fast8_t tmp;
	if (cstate->numcomps <= 256) {
		if (jpc_getuint8(in, &tmp)) {
			return -1;
		}
		rgn->compno = tmp;
	} else {
		if (jpc_getuint16(in, &rgn->compno)) {
			return -1;
		}
	}
	if (jpc_getuint8(in, &rgn->roisty) ||
	  jpc_getuint8(in, &rgn->roishift)) {
		return -1;
	}
	return 0;
}